

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_edge.c
# Opt level: O2

REF_STATUS ref_edge_ghost_min_int(REF_EDGE ref_edge,REF_MPI ref_mpi,REF_INT *data)

{
  REF_INT *pRVar1;
  REF_NODE pRVar2;
  uint uVar3;
  REF_INT *send_size;
  long lVar4;
  REF_INT *pRVar5;
  ulong uVar6;
  void *pvVar7;
  void *pvVar8;
  undefined4 *__ptr;
  int iVar9;
  long lVar10;
  undefined8 uVar11;
  int iVar12;
  uint uVar13;
  char *pcVar14;
  long lVar15;
  ulong uVar16;
  size_t sVar17;
  int local_90;
  int local_8c;
  REF_NODE local_88;
  REF_INT node1;
  REF_INT node0;
  void *local_78;
  void *local_70;
  void *local_68;
  void *local_60;
  void *local_58;
  REF_INT *local_50;
  REF_INT *local_48;
  size_t local_40;
  ulong local_38;
  
  lVar15 = (long)ref_mpi->n;
  if (lVar15 < 2) {
    return 0;
  }
  local_88 = ref_edge->node;
  send_size = (REF_INT *)malloc(lVar15 * 4);
  if (send_size == (REF_INT *)0x0) {
    pcVar14 = "malloc a_size of REF_INT NULL";
    uVar11 = 0x16d;
  }
  else {
    for (lVar4 = 0; lVar15 != lVar4; lVar4 = lVar4 + 1) {
      send_size[lVar4] = 0;
    }
    pRVar5 = (REF_INT *)malloc(lVar15 * 4);
    if (pRVar5 == (REF_INT *)0x0) {
      pcVar14 = "malloc b_size of REF_INT NULL";
      uVar11 = 0x16e;
    }
    else {
      for (lVar4 = 0; lVar15 != lVar4; lVar4 = lVar4 + 1) {
        pRVar5[lVar4] = 0;
      }
      iVar9 = ref_edge->n;
      iVar12 = 0;
      if (iVar9 < 1) {
        iVar9 = 0;
      }
      local_50 = data;
      local_48 = pRVar5;
      for (; pRVar5 = local_48, iVar9 != iVar12; iVar12 = iVar12 + 1) {
        ref_edge_part(ref_edge,iVar12,&local_90);
        if (local_90 != ref_mpi->id) {
          send_size[local_90] = send_size[local_90] + 1;
        }
      }
      uVar3 = ref_mpi_alltoall(ref_mpi,send_size,local_48,1);
      if (uVar3 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_edge.c",
               0x176,"ref_edge_ghost_min_int",(ulong)uVar3,"alltoall sizes");
        return uVar3;
      }
      uVar3 = ref_mpi->n;
      uVar6 = 0;
      uVar16 = 0;
      if (0 < (int)uVar3) {
        uVar16 = (ulong)uVar3;
      }
      uVar13 = 0;
      for (; uVar16 != uVar6; uVar6 = uVar6 + 1) {
        uVar13 = uVar13 + send_size[uVar6];
      }
      if ((int)uVar13 < 0) {
        pcVar14 = "malloc a_nodes of REF_GLOB negative";
        uVar11 = 0x17a;
        goto LAB_001a1e24;
      }
      pvVar7 = malloc((ulong)(uVar13 * 2) << 3);
      if (pvVar7 == (void *)0x0) {
        pcVar14 = "malloc a_nodes of REF_GLOB NULL";
        uVar11 = 0x17a;
      }
      else {
        local_38 = (ulong)uVar13;
        local_68 = (void *)(local_38 * 4);
        local_58 = pvVar7;
        pvVar7 = malloc((size_t)local_68);
        if (pvVar7 == (void *)0x0) {
          pcVar14 = "malloc a_data of REF_INT NULL";
          uVar11 = 0x17b;
        }
        else {
          local_68 = malloc((size_t)local_68);
          if (local_68 == (void *)0x0) {
            pcVar14 = "malloc a_edge of REF_INT NULL";
            uVar11 = 0x17c;
          }
          else {
            uVar13 = 0;
            for (uVar6 = 0; uVar16 != uVar6; uVar6 = uVar6 + 1) {
              uVar13 = uVar13 + pRVar5[uVar6];
            }
            local_60 = pvVar7;
            if ((int)uVar13 < 0) {
              pcVar14 = "malloc b_nodes of REF_GLOB negative";
              uVar11 = 0x180;
LAB_001a1e24:
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_edge.c"
                     ,uVar11,"ref_edge_ghost_min_int",pcVar14);
              return 1;
            }
            pvVar7 = malloc((ulong)(uVar13 * 2) << 3);
            if (pvVar7 == (void *)0x0) {
              pcVar14 = "malloc b_nodes of REF_GLOB NULL";
              uVar11 = 0x180;
            }
            else {
              local_40 = (ulong)uVar13 << 2;
              pvVar8 = malloc(local_40);
              if (pvVar8 == (void *)0x0) {
                pcVar14 = "malloc b_data of REF_INT NULL";
                uVar11 = 0x181;
              }
              else {
                if ((int)uVar3 < 0) {
                  pcVar14 = "malloc a_next of REF_INT negative";
                  uVar11 = 0x183;
                  goto LAB_001a1e24;
                }
                __ptr = (undefined4 *)malloc((ulong)uVar3 * 4);
                if (__ptr != (undefined4 *)0x0) {
                  *__ptr = 0;
                  iVar9 = 0;
                  for (uVar6 = 1; uVar6 < uVar3; uVar6 = uVar6 + 1) {
                    iVar9 = iVar9 + send_size[uVar6 - 1];
                    __ptr[uVar6] = iVar9;
                  }
                  local_90 = (int)uVar6;
                  uVar16 = 0;
                  local_78 = pvVar7;
                  local_70 = pvVar8;
                  uVar6 = (ulong)(uint)ref_edge->n;
                  if (ref_edge->n < 1) {
                    uVar6 = uVar16;
                  }
                  for (; uVar6 != uVar16; uVar16 = uVar16 + 1) {
                    ref_edge_part(ref_edge,(REF_INT)uVar16,&local_90);
                    if (local_90 != ref_mpi->id) {
                      iVar9 = __ptr[local_90];
                      lVar10 = (long)iVar9;
                      *(REF_INT *)((long)local_68 + lVar10 * 4) = (REF_INT)uVar16;
                      *(REF_INT *)((long)local_60 + lVar10 * 4) = local_50[uVar16];
                      pRVar1 = ref_edge->e2n;
                      iVar12 = pRVar1[uVar16 * 2];
                      lVar15 = -1;
                      lVar4 = lVar15;
                      if (((-1 < (long)iVar12) && (iVar12 < local_88->max)) &&
                         (lVar4 = local_88->global[iVar12], local_88->global[iVar12] < 0)) {
                        lVar4 = lVar15;
                      }
                      *(long *)((long)local_58 + lVar10 * 0x10) = lVar4;
                      iVar12 = pRVar1[uVar16 * 2 + 1];
                      lVar4 = lVar15;
                      if (((-1 < (long)iVar12) && (iVar12 < local_88->max)) &&
                         (lVar4 = local_88->global[iVar12], local_88->global[iVar12] < 0)) {
                        lVar4 = lVar15;
                      }
                      *(long *)((long)local_58 + (long)(int)(iVar9 * 2 | 1) * 8) = lVar4;
                      __ptr[local_90] = iVar9 + 1;
                    }
                  }
                  local_8c = (int)uVar6;
                  uVar3 = ref_mpi_alltoallv(ref_mpi,local_58,send_size,local_78,pRVar5,2,2);
                  if (uVar3 == 0) {
                    uVar3 = ref_mpi_alltoallv(ref_mpi,local_60,send_size,local_70,pRVar5,1,1);
                    if (uVar3 == 0) {
                      for (sVar17 = 0; pRVar2 = local_88, local_40 != sVar17; sVar17 = sVar17 + 4) {
                        uVar3 = ref_node_local(local_88,*(REF_GLOB *)((long)local_78 + sVar17 * 4),
                                               &node0);
                        if (uVar3 != 0) {
                          pcVar14 = "loc 0";
                          uVar11 = 0x19e;
                          goto LAB_001a218d;
                        }
                        uVar3 = ref_node_local(pRVar2,*(REF_GLOB *)((long)local_78 + sVar17 * 4 + 8)
                                               ,&node1);
                        if (uVar3 != 0) {
                          pcVar14 = "loc 1";
                          uVar11 = 0x19f;
                          goto LAB_001a218d;
                        }
                        uVar3 = ref_edge_with(ref_edge,node0,node1,&local_8c);
                        if (uVar3 != 0) {
                          pcVar14 = "find edge";
                          uVar11 = 0x1a0;
                          goto LAB_001a218d;
                        }
                        iVar9 = local_50[local_8c];
                        if (*(int *)((long)local_70 + sVar17) < local_50[local_8c]) {
                          iVar9 = *(int *)((long)local_70 + sVar17);
                        }
                        local_50[local_8c] = iVar9;
                      }
                      for (sVar17 = 0; pRVar2 = local_88, local_40 != sVar17; sVar17 = sVar17 + 4) {
                        uVar3 = ref_node_local(local_88,*(REF_GLOB *)((long)local_78 + sVar17 * 4),
                                               &node0);
                        if (uVar3 != 0) {
                          pcVar14 = "loc 0";
                          uVar11 = 0x1a5;
                          goto LAB_001a218d;
                        }
                        uVar3 = ref_node_local(pRVar2,*(REF_GLOB *)((long)local_78 + sVar17 * 4 + 8)
                                               ,&node1);
                        if (uVar3 != 0) {
                          pcVar14 = "loc 1";
                          uVar11 = 0x1a6;
                          goto LAB_001a218d;
                        }
                        uVar3 = ref_edge_with(ref_edge,node0,node1,&local_8c);
                        if (uVar3 != 0) {
                          pcVar14 = "find edge";
                          uVar11 = 0x1a7;
                          goto LAB_001a218d;
                        }
                        *(REF_INT *)((long)local_70 + sVar17) = local_50[local_8c];
                      }
                      uVar3 = ref_mpi_alltoallv(ref_mpi,local_70,local_48,local_60,send_size,1,1);
                      pvVar7 = local_60;
                      if (uVar3 == 0) {
                        for (uVar6 = 0; local_38 != uVar6; uVar6 = uVar6 + 1) {
                          local_50[*(int *)((long)local_68 + uVar6 * 4)] =
                               *(REF_INT *)((long)local_60 + uVar6 * 4);
                        }
                        free(__ptr);
                        free(local_70);
                        free(local_78);
                        free(local_68);
                        free(pvVar7);
                        free(local_58);
                        free(local_48);
                        free(send_size);
                        return 0;
                      }
                      pcVar14 = "alltoallv return data";
                      uVar11 = 0x1ad;
                    }
                    else {
                      pcVar14 = "alltoallv requested data";
                      uVar11 = 0x19a;
                    }
                  }
                  else {
                    pcVar14 = "alltoallv requested nodes";
                    uVar11 = 0x197;
                  }
LAB_001a218d:
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_edge.c"
                         ,uVar11,"ref_edge_ghost_min_int",(ulong)uVar3,pcVar14);
                  return uVar3;
                }
                pcVar14 = "malloc a_next of REF_INT NULL";
                uVar11 = 0x183;
              }
            }
          }
        }
      }
    }
  }
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_edge.c",uVar11,
         "ref_edge_ghost_min_int",pcVar14);
  return 2;
}

Assistant:

REF_FCN REF_STATUS ref_edge_ghost_min_int(REF_EDGE ref_edge, REF_MPI ref_mpi,
                                          REF_INT *data) {
  REF_NODE ref_node = ref_edge_node(ref_edge);
  REF_INT *a_size, *b_size;
  REF_INT a_total, b_total;
  REF_INT edge;
  REF_INT part;
  REF_INT *a_next, *a_edge;
  REF_GLOB *a_nodes, *b_nodes;
  REF_INT *a_data, *b_data;

  REF_INT node0, node1;
  REF_INT request;

  if (!ref_mpi_para(ref_mpi)) return REF_SUCCESS;

  ref_malloc_init(a_size, ref_mpi_n(ref_mpi), REF_INT, 0);
  ref_malloc_init(b_size, ref_mpi_n(ref_mpi), REF_INT, 0);

  for (edge = 0; edge < ref_edge_n(ref_edge); edge++) {
    RSS(ref_edge_part(ref_edge, edge, &part), "edge part");
    if (part != ref_mpi_rank(ref_mpi)) a_size[part]++;
  }

  RSS(ref_mpi_alltoall(ref_mpi, a_size, b_size, REF_INT_TYPE),
      "alltoall sizes");

  a_total = 0;
  each_ref_mpi_part(ref_mpi, part) a_total += a_size[part];
  ref_malloc(a_nodes, 2 * a_total, REF_GLOB);
  ref_malloc(a_data, a_total, REF_INT);
  ref_malloc(a_edge, a_total, REF_INT);

  b_total = 0;
  each_ref_mpi_part(ref_mpi, part) b_total += b_size[part];
  ref_malloc(b_nodes, 2 * b_total, REF_GLOB);
  ref_malloc(b_data, b_total, REF_INT);

  ref_malloc(a_next, ref_mpi_n(ref_mpi), REF_INT);
  a_next[0] = 0;
  each_ref_mpi_worker(ref_mpi, part) a_next[part] =
      a_next[part - 1] + a_size[part - 1];

  for (edge = 0; edge < ref_edge_n(ref_edge); edge++) {
    RSS(ref_edge_part(ref_edge, edge, &part), "edge part");
    if (part != ref_mpi_rank(ref_mpi)) {
      a_edge[a_next[part]] = edge;
      a_data[a_next[part]] = data[edge];
      a_nodes[0 + 2 * a_next[part]] =
          ref_node_global(ref_node, ref_edge_e2n(ref_edge, 0, edge));
      a_nodes[1 + 2 * a_next[part]] =
          ref_node_global(ref_node, ref_edge_e2n(ref_edge, 1, edge));
      (a_next[part])++;
    }
  }

  RSS(ref_mpi_alltoallv(ref_mpi, a_nodes, a_size, b_nodes, b_size, 2,
                        REF_GLOB_TYPE),
      "alltoallv requested nodes");
  RSS(ref_mpi_alltoallv(ref_mpi, a_data, a_size, b_data, b_size, 1,
                        REF_INT_TYPE),
      "alltoallv requested data");

  /* min local data with remote ghost data */
  for (request = 0; request < b_total; request++) {
    RSS(ref_node_local(ref_node, b_nodes[0 + 2 * request], &node0), "loc 0");
    RSS(ref_node_local(ref_node, b_nodes[1 + 2 * request], &node1), "loc 1");
    RSS(ref_edge_with(ref_edge, node0, node1, &edge), "find edge");
    data[edge] = MIN(b_data[request], data[edge]);
  }
  /* export local consistent data */
  for (request = 0; request < b_total; request++) {
    RSS(ref_node_local(ref_node, b_nodes[0 + 2 * request], &node0), "loc 0");
    RSS(ref_node_local(ref_node, b_nodes[1 + 2 * request], &node1), "loc 1");
    RSS(ref_edge_with(ref_edge, node0, node1, &edge), "find edge");
    b_data[request] = data[edge];
  }

  RSS(ref_mpi_alltoallv(ref_mpi, b_data, b_size, a_data, a_size, 1,
                        REF_INT_TYPE),
      "alltoallv return data");

  for (request = 0; request < a_total; request++) {
    data[a_edge[request]] = a_data[request];
  }

  ref_free(a_next);

  ref_free(b_data);
  ref_free(b_nodes);

  ref_free(a_edge);

  ref_free(a_data);
  ref_free(a_nodes);

  ref_free(b_size);
  ref_free(a_size);

  return REF_SUCCESS;
}